

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

void __thiscall Minisat::Solver::binDRUP_flush(Solver *this,FILE *drup_file)

{
  fwrite_unlocked(drup_buf,1,(long)this->buf_len,(FILE *)drup_file);
  this->buf_ptr = drup_buf;
  this->buf_len = 0;
  return;
}

Assistant:

inline void binDRUP_flush(FILE *drup_file)
    {
#if defined(__linux__)
        fwrite_unlocked(drup_buf, sizeof(unsigned char), buf_len, drup_file);
#else
        fwrite(drup_buf, sizeof(unsigned char), buf_len, drup_file);
#endif
        buf_ptr = drup_buf;
        buf_len = 0;
    }